

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring_checked.hh
# Opt level: O0

void __thiscall doublechecked::Roaring::Roaring(Roaring *this,Roaring *other_plain)

{
  RoaringSetBitBiDirectionalIterator *this_00;
  value_type_conflict *in_RDI;
  pair<std::_Rb_tree_const_iterator<unsigned_int>,_bool> pVar1;
  value_type value;
  RoaringSetBitBiDirectionalIterator __end2;
  RoaringSetBitBiDirectionalIterator __begin2;
  Roaring *__range2;
  undefined7 in_stack_ffffffffffffff38;
  undefined1 in_stack_ffffffffffffff3f;
  Roaring *in_stack_ffffffffffffff40;
  undefined7 in_stack_ffffffffffffff48;
  undefined1 in_stack_ffffffffffffff4f;
  Roaring *in_stack_ffffffffffffff50;
  value_type_conflict *__x;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *this_01;
  undefined1 local_78 [56];
  RoaringSetBitBiDirectionalIterator local_40;
  
  __x = in_RDI;
  roaring::Roaring::Roaring(in_stack_ffffffffffffff40);
  this_01 = (set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
            (in_RDI + 10);
  std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::set
            ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)0x110c04);
  roaring::Roaring::operator=
            (in_stack_ffffffffffffff40,
             (Roaring *)CONCAT17(in_stack_ffffffffffffff3f,in_stack_ffffffffffffff38));
  roaring::Roaring::begin(in_stack_ffffffffffffff40);
  this_00 = roaring::Roaring::end(in_stack_ffffffffffffff50);
  memcpy(local_78,this_00,0x28);
  while( true ) {
    in_stack_ffffffffffffff4f =
         roaring::RoaringSetBitBiDirectionalIterator::operator!=
                   (this_00,(RoaringSetBitBiDirectionalIterator *)
                            CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48));
    if (!(bool)in_stack_ffffffffffffff4f) break;
    roaring::RoaringSetBitBiDirectionalIterator::operator*(&local_40);
    pVar1 = std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::insert
                      (this_01,__x);
    roaring::RoaringSetBitBiDirectionalIterator::operator++
              ((RoaringSetBitBiDirectionalIterator *)pVar1.first._M_node._M_node);
  }
  return;
}

Assistant:

Roaring(roaring::Roaring &&other_plain) {
        plain = std::move(other_plain);
        for (auto value : plain) check.insert(value);
    }